

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strljustify_s.c
# Opt level: O2

errno_t strljustify_s(char *dest,rsize_t dmax)

{
  long lVar1;
  long lVar2;
  char cVar3;
  rsize_t rVar4;
  long lVar5;
  char cVar6;
  errno_t error;
  long lVar7;
  errno_t eVar8;
  char *msg;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (dest == (char *)0x0) {
    msg = "strljustify_s_s: dest is null";
    eVar8 = 400;
    error = 400;
  }
  else if (dmax == 0) {
    msg = "strljustify_s_s: dmax is 0";
    eVar8 = 0x191;
    error = 0x191;
  }
  else {
    if (dmax < 0x10000001) {
      cVar3 = *dest;
      if (dmax == 1 || cVar3 == '\0') {
        *dest = '\0';
      }
      else {
        rVar4 = 0;
        cVar6 = cVar3;
LAB_00105d5e:
        if (cVar6 != '\0') {
          if (dmax != rVar4) goto code_r0x00105d67;
          for (rVar4 = 0; dmax != rVar4; rVar4 = rVar4 + 1) {
            dest[rVar4] = '\0';
          }
          msg = "strljustify_s: dest is unterminated";
          eVar8 = 0x197;
          error = 0x197;
          goto LAB_00105d1f;
        }
        lVar5 = 0;
        while ((cVar3 == ' ' || (cVar3 == '\t'))) {
          lVar7 = lVar5 + 1;
          lVar5 = lVar5 + 1;
          cVar3 = dest[lVar7];
        }
        eVar8 = 0;
        if (cVar3 == '\0' || lVar5 == 0) goto LAB_00105d24;
        lVar7 = 0;
        while (cVar3 != '\0') {
          lVar2 = lVar7 + 1;
          dest[lVar7] = cVar3;
          dest[lVar5 + lVar7] = ' ';
          lVar7 = lVar7 + 1;
          cVar3 = dest[lVar5 + lVar2];
        }
        dest[lVar7] = '\0';
      }
      eVar8 = 0;
      goto LAB_00105d24;
    }
    msg = "strljustify_s_s: dmax exceeds max";
    eVar8 = 0x193;
    error = 0x193;
  }
LAB_00105d1f:
  invoke_safe_str_constraint_handler(msg,(void *)0x0,error);
LAB_00105d24:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return eVar8;
  }
  __stack_chk_fail();
code_r0x00105d67:
  cVar6 = dest[rVar4 + 1];
  rVar4 = rVar4 + 1;
  goto LAB_00105d5e;
}

Assistant:

errno_t
strljustify_s (char *dest, rsize_t dmax)
{
    char *orig_dest;
    rsize_t orig_dmax;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strljustify_s_s: "
                   "dest is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (dmax == 0 ) {
        invoke_safe_str_constraint_handler("strljustify_s_s: "
                   "dmax is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strljustify_s_s: "
                   "dmax exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }

    /*
     * corner case, a dmax of one allows only for a null
     */
    if (*dest == '\0' || dmax <= RSIZE_MIN_STR) {
        *dest = '\0';
        return (EOK);
    }

    orig_dmax = dmax;
    orig_dest = dest;

     /*
      * scan the string to be sure it is properly terminated
      */
     while (*dest) {
        if (dmax == 0) {
            while (orig_dmax) { *orig_dest++ = '\0';  orig_dmax--; }

            invoke_safe_str_constraint_handler(
                      "strljustify_s: dest is unterminated",
                       NULL, ESUNTERM);
            return (ESUNTERM);
        }
        dmax--;
        dest++;
    }

    /*
     * find first non-white space char
     */
    dest = orig_dest;
    while ((*dest == ' ') || (*dest == '\t')) {
        dest++;
    }

   /*
    * shift text, removing spaces, to left justify
    */
    if (orig_dest != dest && *dest) {
        while (*dest) {
            *orig_dest++ = *dest;
            *dest++ = ' ';
        }
        *orig_dest = '\0';
    }

    return (EOK);
}